

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderPass.cpp
# Opt level: O2

SubpassAttachmentHandle __thiscall
myvk::RenderPassState::SubpassAttachmentHandle::SetDepthStencilAttachment
          (SubpassAttachmentHandle *this,char *attachment_str,VkImageLayout layout,
          char *src_subpass_str,VkPipelineStageFlags src_stage,VkPipelineStageFlags use_stage,
          VkAccessFlags src_access,VkAccessFlags use_access,VkDependencyFlags dependency_flag)

{
  uint uVar1;
  RenderPassState *pRVar2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  uint32_t uVar7;
  uint32_t *puVar8;
  SubpassAttachmentHandle SVar9;
  
  pRVar2 = this->m_state_ptr;
  uVar1 = this->m_subpass;
  lVar3 = *(long *)(pRVar2 + 0x78);
  lVar4 = *(long *)(pRVar2 + 0x90);
  uVar7 = get_attachment(pRVar2,attachment_str);
  lVar3 = lVar3 + (ulong)uVar1 * 0x50;
  puVar8 = (uint32_t *)(lVar3 + 0x48);
  *puVar8 = uVar7;
  *(VkImageLayout *)(lVar3 + 0x4c) = layout;
  *(uint32_t **)(lVar4 + 0x30 + (ulong)uVar1 * 0x48) = puVar8;
  pRVar2 = this->m_state_ptr;
  uVar7 = get_subpass(pRVar2,src_subpass_str);
  insert_subpass_dependency
            (pRVar2,uVar7,this->m_subpass,src_stage,use_stage,src_access,use_access,dependency_flag)
  ;
  uVar5 = this->m_state_ptr;
  uVar6 = this->m_subpass;
  SVar9.m_subpass = uVar6;
  SVar9.m_state_ptr = (RenderPassState *)uVar5;
  SVar9._12_4_ = 0;
  return SVar9;
}

Assistant:

RenderPassState::SubpassAttachmentHandle RenderPassState::SubpassAttachmentHandle::SetDepthStencilAttachment(
    const char *attachment_str, VkImageLayout layout, const char *src_subpass_str, VkPipelineStageFlags src_stage,
    VkPipelineStageFlags use_stage, VkAccessFlags src_access, VkAccessFlags use_access,
    VkDependencyFlags dependency_flag) {
	auto &info = m_state_ptr->m_subpass_infos[m_subpass];
	auto &des = m_state_ptr->m_subpass_descriptions[m_subpass];
	assert(des.pDepthStencilAttachment == nullptr);

	info.depth_stencil_attachment_reference = {m_state_ptr->get_attachment(attachment_str), layout};
	des.pDepthStencilAttachment = &(info.depth_stencil_attachment_reference);

	m_state_ptr->insert_subpass_dependency(m_state_ptr->get_subpass(src_subpass_str), m_subpass, src_stage, use_stage,
	                                       src_access, use_access, dependency_flag);
	return *this;
}